

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall
level_tools::register_scene_object
          (level_tools *this,char *name,string *reference,fmatrix *xform,uint32_t file_version)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  xr_visual_object *this_00;
  undefined1 auVar14 [16];
  xr_visual_object *local_38;
  
  this_00 = (xr_visual_object *)operator_new(0x98);
  xray_re::xr_visual_object::xr_visual_object(this_00,this->m_scene);
  make_object_ref(this,&(this_00->super_xr_custom_object).m_name,name);
  *(undefined8 *)&(this_00->super_xr_custom_object).m_position.field_0 =
       *(undefined8 *)((long)&xform->field_0 + 0x30);
  (this_00->super_xr_custom_object).m_position.field_0.field_0.z = (xform->field_0).field_0._43;
  fVar8 = (xform->field_0).field_0._11;
  fVar9 = (xform->field_0).field_0._13;
  fVar10 = (xform->field_0).field_0._14;
  fVar11 = (xform->field_0).field_0._12;
  fVar12 = (xform->field_0).field_0._14;
  fVar13 = (xform->field_0).field_0._21;
  auVar14 = *(undefined1 (*) [16])((long)&xform->field_0 + 8);
  fVar1 = (xform->field_0).field_0._31;
  fVar2 = (xform->field_0).field_0._32;
  fVar3 = (xform->field_0).field_0._33;
  fVar4 = (xform->field_0).field_0._22;
  fVar5 = (xform->field_0).field_0._21;
  fVar6 = (xform->field_0).field_0._23;
  auVar7._4_4_ = fVar6 * fVar6 + fVar5 * fVar5 + fVar4 * fVar4;
  auVar7._0_4_ = auVar14._0_4_ * auVar14._0_4_ + fVar8 * fVar8 + fVar11 * fVar11;
  auVar7._8_4_ = auVar14._8_4_ * auVar14._8_4_ + fVar9 * fVar9 + fVar12 * fVar12;
  auVar7._12_4_ = auVar14._12_4_ * auVar14._12_4_ + fVar10 * fVar10 + fVar13 * fVar13;
  auVar14 = sqrtps(auVar14,auVar7);
  *(long *)&(this_00->super_xr_custom_object).m_scale.field_0 = auVar14._0_8_;
  (this_00->super_xr_custom_object).m_scale.field_0.field_0.z =
       SQRT(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
  xray_re::_matrix<float>::get_xyz(xform,&(this_00->super_xr_custom_object).m_rotation);
  *(uint32_t *)&(this_00->super_xr_custom_object).field_0x6c = file_version;
  std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
  local_38 = this_00;
  std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
  emplace_back<xray_re::xr_custom_object*>
            ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
             this->m_scene_visuals,(xr_custom_object **)&local_38);
  return;
}

Assistant:

void level_tools::register_scene_object(const char* name, const std::string& reference, const fmatrix& xform, uint32_t file_version)
{
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	// name it just like LE does
	make_object_ref(new_visual->co_name(), name);
	new_visual->co_position().set(xform.c);
	new_visual->co_scale().set(xform.i.magnitude(),
			xform.j.magnitude(), xform.k.magnitude());
	xform.get_xyz(new_visual->co_rotation());
	new_visual->file_version() = file_version;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
}